

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O0

string * __thiscall
lightconf::token_name_abi_cxx11_(string *__return_storage_ptr__,lightconf *this,token *tok)

{
  lightconf lVar1;
  allocator local_75;
  allocator local_74;
  allocator local_73;
  allocator local_72;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  lightconf *local_18;
  token *tok_local;
  
  local_18 = this;
  tok_local = (token *)__return_storage_ptr__;
  switch(*(undefined4 *)this) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<none>",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"string",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"identifier",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"number",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 4:
    lVar1 = this[0x30];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,1,(char)lVar1,&local_71);
    std::operator+(&local_50,"\'",&local_70);
    std::operator+(__return_storage_ptr__,&local_50,"\'");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"whitespace",&local_73);
    std::allocator<char>::~allocator((allocator<char> *)&local_73);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"comment",&local_72);
    std::allocator<char>::~allocator((allocator<char> *)&local_72);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"eof",&local_74);
    std::allocator<char>::~allocator((allocator<char> *)&local_74);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<unknown>",&local_75);
    std::allocator<char>::~allocator((allocator<char> *)&local_75);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string token_name(const token& tok) {
    switch (tok.type) {
    case token_type::none_token: return "<none>";
    case token_type::identifier_token: return "identifier";
    case token_type::string_token: return "string";
    case token_type::number_token: return "number";
    case token_type::char_token: return "'" + std::string(1, tok.char_value) + "'";
    case token_type::comment_token: return "comment";
    case token_type::whitespace_token: return "whitespace";
    case token_type::eof_token: return "eof";
    default: return "<unknown>";
    }
}